

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

SimpleString __thiscall SimpleString::printable(SimpleString *this)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t i;
  size_t sVar5;
  SimpleString *in_RSI;
  long lVar6;
  SimpleString SVar7;
  SimpleString hexEscapeCode;
  
  SimpleString(this,"");
  sVar3 = getPrintableSize(in_RSI);
  setInternalBufferToNewBuffer(this,sVar3 + 1);
  sVar4 = size(in_RSI);
  pcVar2 = this->buffer_;
  lVar6 = 0;
  sVar3 = extraout_RDX;
  for (sVar5 = 0; sVar4 != sVar5; sVar5 = sVar5 + 1) {
    cVar1 = in_RSI->buffer_[sVar5];
    if ((byte)(cVar1 - 7U) < 7) {
      StrNCpy(pcVar2 + lVar6,
              _ZZNK12SimpleString9printableEvE16shortEscapeCodes_rel +
              *(int *)(_ZZNK12SimpleString9printableEvE16shortEscapeCodes_rel +
                      (ulong)(byte)(cVar1 - 7U) * 4),2);
      lVar6 = lVar6 + 2;
      sVar3 = extraout_RDX_00;
    }
    else if ((byte)(cVar1 + 0x81U) < 0xa1) {
      StringFromFormat((char *)&hexEscapeCode,"\\x%02X ",(ulong)(uint)(int)cVar1);
      StrNCpy(pcVar2 + lVar6,hexEscapeCode.buffer_,4);
      lVar6 = lVar6 + 4;
      ~SimpleString(&hexEscapeCode);
      sVar3 = extraout_RDX_01;
    }
    else {
      pcVar2[lVar6] = cVar1;
      lVar6 = lVar6 + 1;
    }
  }
  pcVar2[lVar6] = '\0';
  SVar7.bufferSize_ = sVar3;
  SVar7.buffer_ = (char *)this;
  return SVar7;
}

Assistant:

SimpleString SimpleString::printable() const
{
    static const char* shortEscapeCodes[] =
    {
        "\\a",
        "\\b",
        "\\t",
        "\\n",
        "\\v",
        "\\f",
        "\\r"
    };

    SimpleString result;
    result.setInternalBufferToNewBuffer(getPrintableSize() + 1);

    size_t str_size = size();
    size_t j = 0;
    for (size_t i = 0; i < str_size; i++)
    {
        char c = buffer_[i];
        if (isControlWithShortEscapeSequence(c))
        {
            StrNCpy(&result.buffer_[j], shortEscapeCodes[(unsigned char)(c - '\a')], 2);
            j += 2;
        }
        else if (isControl(c))
        {
            SimpleString hexEscapeCode = StringFromFormat("\\x%02X ", c);
            StrNCpy(&result.buffer_[j], hexEscapeCode.asCharString(), 4);
            j += 4;
        }
        else
        {
            result.buffer_[j] = c;
            j++;
        }
    }
    result.buffer_[j] = 0;

    return result;
}